

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

uint Catch::rngSeed(void)

{
  uint uVar1;
  long *plVar2;
  
  if ((anonymous_namespace)::g_globalRunContext != (long *)0x0) {
    (**(code **)(*(anonymous_namespace)::g_globalRunContext + 0x60))();
    plVar2 = (long *)(**(code **)(*(anonymous_namespace)::g_globalRunContext + 0x60))();
    uVar1 = (**(code **)(*plVar2 + 0x78))(plVar2);
    return uVar1;
  }
  return 0;
}

Assistant:

unsigned int rngSeed() {
        return getGlobalConfig()
            ? getGlobalConfig()->rngSeed()
            : 0;
    }